

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O1

void __thiscall
serialize_tests::CSerializeMethodsTestSingle::CSerializeMethodsTestSingle
          (CSerializeMethodsTestSingle *this,int intvalin,bool boolvalin,string stringvalin,
          uint8_t *charstrvalin,CTransactionRef *txvalin)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this->intval = intvalin;
  this->boolval = boolvalin;
  paVar1 = &(this->stringval).field_2;
  (this->stringval)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(charstrvalin + 0x10);
  if (*(size_type **)charstrvalin == psVar2) {
    uVar5 = *(undefined8 *)(charstrvalin + 0x18);
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->stringval).field_2 + 8) = uVar5;
  }
  else {
    (this->stringval)._M_dataplus._M_p = (pointer)*(size_type **)charstrvalin;
    (this->stringval).field_2._M_allocated_capacity = *psVar2;
  }
  (this->stringval)._M_string_length = *(size_type *)(charstrvalin + 8);
  *(size_type **)charstrvalin = psVar2;
  charstrvalin[8] = '\0';
  charstrvalin[9] = '\0';
  charstrvalin[10] = '\0';
  charstrvalin[0xb] = '\0';
  charstrvalin[0xc] = '\0';
  charstrvalin[0xd] = '\0';
  charstrvalin[0xe] = '\0';
  charstrvalin[0xf] = '\0';
  charstrvalin[0x10] = '\0';
  (this->txval).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_R9;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_R9[1];
  (this->txval).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    p_Var4 = (txvalin->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    *(element_type **)this->charstrval =
         (txvalin->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this->charstrval + 8) = p_Var4;
    return;
  }
  __stack_chk_fail();
}

Assistant:

CSerializeMethodsTestSingle(int intvalin, bool boolvalin, std::string stringvalin, const uint8_t* charstrvalin, const CTransactionRef& txvalin) : intval(intvalin), boolval(boolvalin), stringval(std::move(stringvalin)), txval(txvalin)
    {
        memcpy(charstrval, charstrvalin, sizeof(charstrval));
    }